

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Node::BeginChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (!binary) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    BeginChildrenAscii(this,(ostream *)local_198,indent);
    std::__cxx11::ostringstream::str();
    StreamWriter<false,_false>::PutString(s,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void FBX::Node::BeginChildren(
    Assimp::StreamWriterLE &s,
    bool binary, int indent
) {
    if (binary) {
        // nothing to do
    } else {
        std::ostringstream ss;
        BeginChildrenAscii(ss, indent);
        s.PutString(ss.str());
    }
}